

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CborMap::Put(Error *__return_storage_ptr__,CborMap *this,int aKey,char *aStr)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  string_view fmt;
  format_args args;
  _Bool local_11d;
  anon_class_1_0_00000001 local_10a;
  v10 local_109;
  v10 *local_108;
  size_t local_100;
  string local_f8;
  _Bool local_d1;
  cn_cbor *pcStack_d0;
  bool succeed;
  cn_cbor *cborStr;
  char *aStr_local;
  CborMap *pCStack_b8;
  int aKey_local;
  CborMap *this_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_a8 [2];
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  cborStr = (cn_cbor *)aStr;
  aStr_local._4_4_ = aKey;
  pCStack_b8 = this;
  this_local = (CborMap *)__return_storage_ptr__;
  pcStack_d0 = cn_cbor_string_create(aStr,(cn_cbor_errback *)0x0);
  local_11d = false;
  if (pcStack_d0 != (cn_cbor *)0x0) {
    local_11d = cn_cbor_mapput_int((this->super_CborValue).mCbor,(long)aStr_local._4_4_,pcStack_d0,
                                   (cn_cbor_errback *)0x0);
  }
  local_d1 = local_11d;
  if (local_11d == false) {
    Put::anon_class_1_0_00000001::operator()(&local_10a);
    local_58 = &local_108;
    local_60 = &local_109;
    bVar1 = ::fmt::v10::operator()(local_60);
    local_100 = bVar1.size_;
    local_108 = (v10 *)bVar1.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_78 = local_108;
    sStack_70 = local_100;
    local_50 = &local_78;
    local_88 = local_108;
    local_80 = local_100;
    local_68 = &local_f8;
    local_48 = local_88;
    sStack_40 = local_80;
    local_a8[0] = ::fmt::v10::
                  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = local_a8;
    local_18 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_f8,local_88,fmt,args);
    Error::Error(__return_storage_ptr__,kOutOfMemory,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  else {
    Error::Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CborMap::Put(int aKey, const char *aStr)
{
    cn_cbor *cborStr = cn_cbor_string_create(aStr, nullptr);
    bool     succeed = cborStr && cn_cbor_mapput_int(mCbor, aKey, cborStr, nullptr);
    return succeed ? ERROR_NONE : ERROR_OUT_OF_MEMORY("CBOR map insert string");
}